

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O1

void __thiscall
coro_io::multithread_context_pool::~multithread_context_pool(multithread_context_pool *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  work *__ptr;
  service_registry *psVar3;
  _func_int ***ppp_Var4;
  service *psVar5;
  
  stop(this);
  std::promise<void>::~promise(&this->promise_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->thds_);
  (this->executor_).super_Executor._vptr_Executor = (_func_int **)&PTR__Executor_00165d88;
  pcVar2 = (this->executor_).super_Executor._name._M_dataplus._M_p;
  paVar1 = &(this->executor_).super_Executor._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  __ptr = (this->work_)._M_t.
          super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>
          ._M_t.
          super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>
          .super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl;
  if (__ptr != (work *)0x0) {
    std::default_delete<asio::io_context::work>::operator()
              ((default_delete<asio::io_context::work> *)&this->work_,__ptr);
  }
  (this->work_)._M_t.
  super___uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context::work_*,_std::default_delete<asio::io_context::work>_>.
  super__Head_base<0UL,_asio::io_context::work_*,_false>._M_head_impl = (work *)0x0;
  for (psVar5 = ((this->ioc_).super_execution_context.service_registry_)->first_service_;
      psVar5 != (service *)0x0; psVar5 = psVar5->next_) {
    (*psVar5->_vptr_service[2])(psVar5);
  }
  psVar3 = (this->ioc_).super_execution_context.service_registry_;
  psVar5 = psVar3->first_service_;
  while (psVar5 != (service *)0x0) {
    ppp_Var4 = &psVar5->_vptr_service;
    psVar5 = psVar5->next_;
    (*(*ppp_Var4)[1])();
    psVar3->first_service_ = psVar5;
  }
  psVar3 = (this->ioc_).super_execution_context.service_registry_;
  if (psVar3 == (service_registry *)0x0) {
    return;
  }
  pthread_mutex_destroy((pthread_mutex_t *)&psVar3->mutex_);
  operator_delete(psVar3,0x40);
  return;
}

Assistant:

~multithread_context_pool() { stop(); }